

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

void __thiscall simple_thread_pool::TaskHandle::reschedule(TaskHandle *this,int64_t new_interval_us)

{
  undefined8 uVar1;
  __pthread_internal_list *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> l;
  time_point cur;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  *(undefined8 *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10) = uVar1;
  if (-1 < (long)in_RSI) {
    in_RDI[1].super___mutex_base._M_mutex.__data.__list.__prev = in_RSI;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10a78f);
  (**(code **)(**(long **)((long)&(in_RDI->super___mutex_base)._M_mutex + 8) + 0x38))();
  return;
}

Assistant:

void reschedule(int64_t new_interval_us = -1) {
        auto cur = std::chrono::system_clock::now();
        {   std::lock_guard<std::mutex> l(tRegisteredLock);
            tRegistered = cur;
            if (new_interval_us >= 0) {
                intervalUs = new_interval_us;
            }
        }
        mgr->checkThreadAndInvoke();
    }